

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O3

bool __thiscall
PairedEnd::Reader<DNA>::Read(Reader<DNA> *this,Sequence<DNA> *fwd,Sequence<DNA> *rev)

{
  int iVar1;
  
  iVar1 = (*((this->mFwdReader).super_SequenceReader<DNA>.mTextReader._M_t.
             super___uniq_ptr_impl<TextReader,_std::default_delete<TextReader>_>._M_t.
             super__Tuple_impl<0UL,_TextReader_*,_std::default_delete<TextReader>_>.
             super__Head_base<0UL,_TextReader_*,_false>._M_head_impl)->_vptr_TextReader[2])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*((this->mRevReader).super_SequenceReader<DNA>.mTextReader._M_t.
                 super___uniq_ptr_impl<TextReader,_std::default_delete<TextReader>_>._M_t.
                 super__Tuple_impl<0UL,_TextReader_*,_std::default_delete<TextReader>_>.
                 super__Head_base<0UL,_TextReader_*,_false>._M_head_impl)->_vptr_TextReader[2])(),
     (char)iVar1 == '\0')) {
    FASTQ::Reader<DNA>::operator>>(&this->mFwdReader,fwd);
    FASTQ::Reader<DNA>::operator>>(&this->mRevReader,rev);
    return true;
  }
  return false;
}

Assistant:

bool Read( Sequence< Alphabet >* fwd, Sequence< Alphabet >* rev ) {
    if( EndOfFile() )
      return false;

    mFwdReader >> *fwd;
    mRevReader >> *rev;

    return true;
  }